

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

void FIX::file_mkdir(char *path)

{
  size_t sVar1;
  long lVar2;
  string createPath;
  allocator<char> local_41;
  char *local_40 [4];
  
  sVar1 = strlen(path);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
  for (lVar2 = 0; lVar2 <= (int)sVar1; lVar2 = lVar2 + 1) {
    std::__cxx11::string::push_back((char)(string *)local_40);
    if (((path[lVar2] == '/') || (path[lVar2] == '\\')) || ((int)sVar1 == lVar2)) {
      mkdir(local_40[0],0x1ff);
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void file_mkdir( const char* path )
{
  int length = (int)strlen( path );
  std::string createPath = "";

  for( const char* pos = path; (pos - path) <= length; ++pos )
  {
    createPath += *pos;
    if( *pos == '/' || *pos == '\\' || (pos - path) == length )
    {
    #ifdef _MSC_VER
      _mkdir( createPath.c_str() );
    #else
      // use umask to override rwx for all
      mkdir( createPath.c_str(), 0777 );
    #endif
    }
  }
}